

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O1

bool fs_create_symlink(string_view target,string_view link)

{
  string_view path;
  string_view path2;
  string_view path1;
  bool bVar1;
  char *pcVar2;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  int iVar3;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  path local_68;
  path local_40;
  
  iVar3 = 0;
  local_88._M_len = in_RDX;
  local_88._M_str = in_RCX;
  local_78._M_len = in_RDI;
  local_78._M_str = in_RSI;
  pcVar2 = (char *)std::_V2::system_category();
  if ((in_RDI == 0) || (in_RDX == 0)) {
    std::_V2::generic_category();
  }
  else {
    path._M_len._4_4_ = in_stack_ffffffffffffff6c;
    path._M_len._0_4_ = iVar3;
    path._M_str = pcVar2;
    bVar1 = fs_is_dir(path);
    if (bVar1) {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_68,&local_78,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_40,&local_88,auto_format);
      std::filesystem::create_directory_symlink
                (&local_68,&local_40,(error_code *)&stack0xffffffffffffff68);
    }
    else {
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_68,&local_78,auto_format);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_40,&local_88,auto_format);
      std::filesystem::create_symlink(&local_68,&local_40,(error_code *)&stack0xffffffffffffff68);
    }
    std::filesystem::__cxx11::path::~path(&local_40);
    std::filesystem::__cxx11::path::~path(&local_68);
    if (iVar3 == 0) {
      return true;
    }
  }
  path1._M_str = local_78._M_str;
  path1._M_len = local_78._M_len;
  path2._M_str = local_88._M_str;
  path2._M_len = local_88._M_len;
  fname._M_str = "fs_create_symlink";
  fname._M_len = 0x11;
  fs_print_error(path1,path2,fname,(error_code *)&stack0xffffffffffffff68);
  return false;
}

Assistant:

bool fs_create_symlink(std::string_view target, std::string_view link)
{
  // create symlink to file or directory

  std::error_code ec;

  // confusing program errors if target is "" -- we'd never make such a symlink in real use.
  // macOS needs empty check to avoid SIGABRT

  if(target.empty() || link.empty()) FFS_UNLIKELY
    ec = std::make_error_code(std::errc::invalid_argument);
  else {
#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))

  DWORD p = SYMBOLIC_LINK_FLAG_ALLOW_UNPRIVILEGED_CREATE;

  if(fs_is_dir(target.data()))
    p |= SYMBOLIC_LINK_FLAG_DIRECTORY;

  if(CreateSymbolicLinkA(link.data(), target.data(), p))  FFS_LIKELY
    return true;

#elif defined(HAVE_CXX_FILESYSTEM)

  fs_is_dir(target)
    ? std::filesystem::create_directory_symlink(target, link, ec)
    : std::filesystem::create_symlink(target, link, ec);

  if(!ec) FFS_LIKELY
    return true;

#else
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man2/symlink.2.html
  // https://linux.die.net/man/3/symlink
  if(symlink(target.data(), link.data()) == 0)  FFS_LIKELY
    return true;
#endif
  }

  fs_print_error(target, link, __func__, ec);
  return false;
}